

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O3

int sfp_get_sm_length(tcv_t *tcv)

{
  void *pvVar1;
  byte bVar2;
  uint uVar3;
  
  uVar3 = 0xfffffffc;
  if ((tcv != (tcv_t *)0x0) && (pvVar1 = tcv->data, pvVar1 != (void *)0x0)) {
    bVar2 = *(char *)((long)pvVar1 + 0xf) * -0x18;
    if (bVar2 == 0) {
      bVar2 = *(char *)((long)pvVar1 + 0x10) * 'd';
    }
    uVar3 = 0xfffffff9;
    if (bVar2 != 0) {
      uVar3 = (uint)bVar2;
    }
  }
  return uVar3;
}

Assistant:

int sfp_get_sm_length(tcv_t *tcv)
{
	unsigned char length;

	if (tcv == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Normalize length to meters */
	length = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_LENGTH_SMF_KM] * 1000;

	/* If Km length is 0, try to read from meters unit register */
	if (length == 0)
		length = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_LENGTH_SMF_100M] * 100;


	return length == 0 ? TCV_ERR_SM_LENGTH_NOT_DEFINED : length;
}